

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O3

bool __thiscall
metaf::VisibilityGroup::appendVariable
          (VisibilityGroup *this,string *group,IncompleteText nextIfMaxIsInteger,
          IncompleteText nextIfMaxIsFraction)

{
  bool bVar1;
  Modifier MVar2;
  uint uVar3;
  Type TVar4;
  size_type sVar5;
  optional<metaf::Distance> min;
  optional<metaf::Distance> max;
  _Storage<metaf::Distance,_true> local_84;
  char local_74;
  string local_70;
  long local_50;
  _Storage<metaf::Distance,_true> local_44;
  char local_34;
  
  sVar5 = std::__cxx11::string::find((char)group,0x56);
  if (sVar5 + 1 < 2) {
    return false;
  }
  if (sVar5 == group->_M_string_length) {
    return false;
  }
  local_50 = std::__cxx11::string::find((char)group,0x2f);
  std::__cxx11::string::substr((ulong)&local_70,(ulong)group);
  Distance::fromMileString((optional<metaf::Distance> *)&local_84._M_value,&local_70,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_74 == '\0') {
    return false;
  }
  std::__cxx11::string::substr((ulong)&local_70,(ulong)group);
  Distance::fromMileString((optional<metaf::Distance> *)&local_44._M_value,&local_70,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_34 == '\0') {
    return false;
  }
  bVar1 = (this->vis).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_engaged;
  MVar2 = (this->vis).distModifier;
  if ((MVar2 - DISTANT < 2 | bVar1) == 1) {
    if (MORE_THAN < MVar2) {
      return false;
    }
    if (local_84._M_value.distModifier != NONE) {
      return false;
    }
    if ((this->vis).distUnit != STATUTE_MILES) {
      return false;
    }
    if (local_84._M_value.distUnit != STATUTE_MILES) {
      return false;
    }
    if (bVar1 == false) {
      return false;
    }
    if (local_84._M_value.dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged != true) {
      return false;
    }
    uVar3 = (this->vis).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_payload._M_value;
    if (0x68db8 < (uVar3 * 0x3afb7e91 >> 4 | uVar3 * 0x10000000)) {
      return false;
    }
    if (((uint)((int)local_84._M_value.dist.super__Optional_base<unsigned_int,_true,_true>.
                     _M_payload.super__Optional_payload_base<unsigned_int>._M_payload * 0x3afb7e91)
         >> 4 | (int)local_84._M_value.dist.super__Optional_base<unsigned_int,_true,_true>.
                     _M_payload.super__Optional_payload_base<unsigned_int>._M_payload * 0x10000000)
        < 0x68db9) {
      return false;
    }
    (this->vis).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int> =
         (_Optional_payload_base<unsigned_int>)
         ((ulong)((int)local_84._M_value.dist.super__Optional_base<unsigned_int,_true,_true>.
                       _M_payload.super__Optional_payload_base<unsigned_int>._M_payload + uVar3) |
         0x100000000);
    (this->vis).distUnit = STATUTE_MILES;
  }
  else {
    (this->vis).distModifier = local_84._0_4_;
    (this->vis).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int>._M_payload =
         (_Storage<unsigned_int,_true>)local_84._4_4_;
    *(ulong *)&(this->vis).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>._M_engaged =
         CONCAT44(local_84._M_value.distUnit,local_84._8_4_);
  }
  (this->visMax).distModifier = local_44._0_4_;
  (this->visMax).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_payload =
       local_44._M_value.dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_int>._M_payload;
  *(undefined8 *)
   &(this->visMax).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int>._M_engaged = local_44._8_8_;
  TVar4 = this->visType;
  if (TVar4 == PREVAILING) {
    TVar4 = VARIABLE_PREVAILING;
  }
  else if (TVar4 == SECTOR) {
    TVar4 = VARIABLE_SECTOR;
  }
  else {
    if (TVar4 != DIRECTIONAL) goto LAB_001a7bbf;
    TVar4 = VARIABLE_DIRECTIONAL;
  }
  this->visType = TVar4;
LAB_001a7bbf:
  if (local_50 == -1) {
    nextIfMaxIsFraction = nextIfMaxIsInteger;
  }
  this->incompleteText = nextIfMaxIsFraction;
  return true;
}

Assistant:

bool VisibilityGroup::appendVariable(const std::string & group,
	IncompleteText nextIfMaxIsInteger,
	IncompleteText nextIfMaxIsFraction)
{
	const auto vPos = group.find('V');
	if (vPos == std::string::npos || 
		!vPos ||
		vPos == group.length()) return false;
	const bool maxInteger = (group.find('/', vPos) == std::string::npos);
	const auto min = 
		Distance::fromMileString(group.substr(0, vPos), true);
	if (!min.has_value()) return false;
	const auto max = 
		Distance::fromMileString(group.substr(vPos + 1), true);
	if (!max.has_value()) return false;

	if (vis.isReported()) {
		const auto v = Distance::fromIntegerAndFraction(vis, std::move(*min));
		if (!v.has_value()) return false;
		vis = std::move(*v);
	} else {
		vis = std::move(*min);
	}
	visMax = std::move(*max);
	makeVariable();
	incompleteText = maxInteger ? nextIfMaxIsInteger : nextIfMaxIsFraction;
	return true;
}